

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase270::run(TestCase270 *this)

{
  Builder builder;
  AsyncOutputStream node;
  ArrayPtr<const_capnp::word> *pAVar1;
  Iface *pIVar2;
  long *plVar3;
  ElementCount index;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  Own<kj::AsyncOutputStream,_std::nullptr_t> output;
  PipeWithSmallBuffer fds;
  Thread thread;
  AsyncIoContext ioContext;
  Builder list;
  Builder root;
  TestMessageBuilder message;
  AsyncOutputStream local_228;
  undefined8 *local_220;
  ArrayPtr<const_capnp::word> *local_218;
  PipeWithSmallBuffer local_210;
  Function<void_()> local_208;
  StructBuilder local_1f8;
  undefined8 *local_1d0;
  long *local_1c8;
  undefined8 *local_1c0;
  long *local_1b8;
  void *local_1b0;
  char *local_1a0;
  undefined *puStackY_198;
  undefined8 local_190;
  ListBuilder local_188;
  SegmentBuilder *local_158;
  CapTableBuilder *pCStackY_150;
  WirePointer *in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec8 [16];
  undefined **ppuVar5;
  void *in_stack_fffffffffffffee0;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer(&local_210);
  kj::setupAsyncIo();
  (**(code **)(*local_1c8 + 8))(&local_220,local_1c8,local_210.fds[1]);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&stack0xfffffffffffffed8,0,FIXED_SIZE);
  ppuVar5 = &PTR__TestMessageBuilder_006b95c0;
  MessageBuilder::getRootInternal((Builder *)&local_1f8,(MessageBuilder *)&stack0xfffffffffffffed8);
  local_188.ptr = (byte *)local_1f8.data;
  local_188.segment = local_1f8.segment;
  local_188.capTable = local_1f8.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_158,(PointerBuilder *)&local_188,(StructSize)0x140006,
             (word *)0x0);
  local_1f8.data = in_stack_fffffffffffffec0 + 0x11;
  local_1f8.segment = local_158;
  local_1f8.capTable = pCStackY_150;
  PointerBuilder::initStructList(&local_188,(PointerBuilder *)&local_1f8,0x10,(StructSize)0x140006);
  if (local_188.elementCount != 0) {
    index = 0;
    do {
      ListBuilder::getStructElement(&local_1f8,&local_188,index);
      builder._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffec8._0_8_;
      builder._builder.data = (void *)in_stack_fffffffffffffec8._8_8_;
      builder._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffec0;
      builder._builder.pointers = (WirePointer *)ppuVar5;
      builder._builder._32_8_ = in_stack_fffffffffffffee0;
      initTestMessage(builder);
      index = index + 1;
    } while (local_188.elementCount != index);
  }
  local_208.impl.ptr = (Iface *)operator_new(0x18);
  (local_208.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___006b97c8;
  local_208.impl.ptr[1]._vptr_Iface = (_func_int **)&local_210;
  local_208.impl.ptr[2]._vptr_Iface = (_func_int **)&local_188;
  local_208.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<capnp::_::(anonymous_namespace)::TestCase270::run()::$_0>>
        ::instance;
  kj::Thread::Thread((Thread *)&local_1f8,&local_208);
  pIVar2 = local_208.impl.ptr;
  if (local_208.impl.ptr != (Iface *)0x0) {
    local_208.impl.ptr = (Iface *)0x0;
    (**(local_208.impl.disposer)->_vptr_Disposer)
              (local_208.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pAVar1 = local_218;
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&stack0xfffffffffffffed8);
  AVar4.size_ = (size_t)AVar4.ptr;
  AVar4.ptr = pAVar1;
  writeMessage(&local_228,AVar4);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async-test.c++"
  ;
  puStackY_198 = &DAT_004d6248;
  local_190 = 0x300000124;
  kj::Promise<void>::wait((Promise<void> *)&local_228,local_1b0);
  node._vptr_AsyncOutputStream = local_228._vptr_AsyncOutputStream;
  if ((PromiseArenaMember *)local_228._vptr_AsyncOutputStream != (PromiseArenaMember *)0x0) {
    local_228._vptr_AsyncOutputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node._vptr_AsyncOutputStream);
  }
  kj::Thread::~Thread((Thread *)&local_1f8);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)&stack0xfffffffffffffed8);
  pAVar1 = local_218;
  if (local_218 != (ArrayPtr<const_capnp::word> *)0x0) {
    local_218 = (ArrayPtr<const_capnp::word> *)0x0;
    (**(code **)*local_220)(local_220,(long)&pAVar1->ptr + pAVar1->ptr[-2].content);
  }
  plVar3 = local_1b8;
  if (local_1b8 != (long *)0x0) {
    local_1b8 = (long *)0x0;
    (**(code **)*local_1c0)(local_1c0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_1c8;
  if (local_1c8 != (long *)0x0) {
    local_1c8 = (long *)0x0;
    (**(code **)*local_1d0)(local_1d0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  PipeWithSmallBuffer::~PipeWithSmallBuffer(&local_210);
  return;
}

Assistant:

TEST(SerializeAsyncTest, WriteAsync) {
  PipeWithSmallBuffer fds;
  auto ioContext = kj::setupAsyncIo();
  auto output = ioContext.lowLevelProvider->wrapOutputFd(fds[1]);

  TestMessageBuilder message(1);
  auto root = message.getRoot<TestAllTypes>();
  auto list = root.initStructList(16);
  for (auto element: list) {
    initTestMessage(element);
  }

  kj::Thread thread([&]() {
    SocketInputStream input(fds[0]);
    InputStreamMessageReader reader(input);
    auto listReader = reader.getRoot<TestAllTypes>().getStructList();
    EXPECT_EQ(list.size(), listReader.size());
    for (auto element: listReader) {
      checkTestMessage(element);
    }
  });

  writeMessage(*output, message).wait(ioContext.waitScope);
}